

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall http_header::http_header(http_header *this,char *str,size_t len)

{
  char *__dest;
  
  this->len = len + 2;
  __dest = lib_alloc_str(len + 2);
  this->str = __dest;
  memcpy(__dest,str,len);
  this->str[len] = '\r';
  this->str[len + 1] = '\n';
  this->nxt = (http_header *)0x0;
  return;
}

Assistant:

http_header(const char *str, size_t len)
    {
        /* allocate the string, with two extra bytes for the CR-LF */
        this->len = len + 2;
        this->str = lib_alloc_str(this->len);

        /* copy the string */
        memcpy(this->str, str, len);

        /* add the CR-LF */
        this->str[len] = '\r';
        this->str[len+1] = '\n';

        /* we're not in a list yet */
        nxt = 0;
    }